

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

string * __thiscall
tcu::FloatFormat::floatToHex_abi_cxx11_(string *__return_storage_ptr__,FloatFormat *this,double x)

{
  int iVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long *plVar5;
  ostream *poVar6;
  size_type *psVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  bool *pbVar11;
  ostream *poVar12;
  int iVar13;
  double __x;
  ulong in_XMM0_Qb;
  int exp;
  ostringstream oss;
  int local_1bc;
  double local_1b8;
  ulong uStack_1b0;
  long *local_1a8 [2];
  long local_198 [12];
  ios_base local_138 [264];
  
  if (NAN(x)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "NaN";
    pcVar8 = "";
  }
  else {
    if (x < -1.79769313486232e+308 == x <= 1.79769313486232e+308) {
      local_1a8[0] = local_198;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"inf","");
      pcVar8 = "+";
      if (x < 0.0) {
        pcVar8 = "-";
      }
      plVar5 = (long *)std::__cxx11::string::replace((ulong)local_1a8,0,(char *)0x0,(ulong)pcVar8);
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      psVar7 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar7) {
        lVar2 = plVar5[3];
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
        *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar2;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar5;
        (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      }
      __return_storage_ptr__->_M_string_length = plVar5[1];
      *plVar5 = (long)psVar7;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      if (local_1a8[0] == local_198) {
        return __return_storage_ptr__;
      }
      operator_delete(local_1a8[0],local_198[0] + 1);
      return __return_storage_ptr__;
    }
    if ((x != 0.0) || (NAN(x))) {
      local_1bc = 0;
      local_1b8 = -x;
      uStack_1b0 = in_XMM0_Qb ^ 0x8000000000000000;
      __x = deFractExp((double)(~-(ulong)(local_1b8 <= x) & (ulong)local_1b8 |
                               -(ulong)(local_1b8 <= x) & (ulong)x),&local_1bc);
      iVar4 = this->m_minExp - local_1bc;
      if (iVar4 < 1) {
        iVar4 = 0;
      }
      iVar4 = this->m_fractionBits - iVar4;
      ldexp(__x,iVar4);
      iVar1 = this->m_fractionBits;
      iVar13 = local_1bc + iVar1;
      iVar9 = iVar1 + 6;
      if (-1 < iVar1 + 3) {
        iVar9 = iVar1 + 3;
      }
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      pbVar11 = deqp::gles31::Functional::SSBOArrayLengthTests::init::arraysSized + 1;
      if (x < local_1b8) {
        pbVar11 = (bool *)0x9ed8ef;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pbVar11,(ulong)(x < local_1b8));
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"0x",2);
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,".",1);
      lVar2 = *(long *)poVar6;
      *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) =
           *(uint *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(long *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = (long)(iVar9 >> 2);
      poVar12 = poVar6 + *(long *)(lVar2 + -0x18);
      if (poVar6[*(long *)(lVar2 + -0x18) + 0xe1] == (ostream)0x0) {
        std::ios::widen((char)poVar12);
        poVar12[0xe1] = (ostream)0x1;
      }
      poVar12[0xe0] = (ostream)0x30;
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      std::__ostream_insert<char,std::char_traits<char>>(poVar6,"p",1);
      lVar2 = *(long *)poVar6;
      lVar3 = *(long *)(lVar2 + -0x18);
      *(uint *)(poVar6 + lVar3 + 0x18) = *(uint *)(poVar6 + lVar3 + 0x18) & 0xffffffb5 | 2;
      *(undefined8 *)(poVar6 + *(long *)(lVar2 + -0x18) + 0x10) = 0;
      std::ostream::operator<<(poVar6,iVar13 - iVar4);
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar10 = "0.0";
    pcVar8 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar10,pcVar8);
  return __return_storage_ptr__;
}

Assistant:

std::string	FloatFormat::floatToHex	(double x) const
{
	if (deIsNaN(x))
		return "NaN";
	else if (deIsInf(x))
		return (x < 0.0 ? "-" : "+") + std::string("inf");
	else if (x == 0.0) // \todo [2014-03-27 lauri] Negative zero
		return "0.0";

	int					exp			= 0;
	const double		frac		= deFractExp(deAbs(x), &exp);
	const int			shift		= exponentShift(exp);
	const deUint64		bits		= deUint64(deLdExp(frac, shift));
	const deUint64		whole		= bits >> m_fractionBits;
	const deUint64		fraction	= bits & ((deUint64(1) << m_fractionBits) - 1);
	const int			exponent	= exp + m_fractionBits - shift;
	const int			numDigits	= (m_fractionBits + 3) / 4;
	const deUint64		aligned		= fraction << (numDigits * 4 - m_fractionBits);
	std::ostringstream	oss;

	oss << (x < 0 ? "-" : "")
		<< "0x" << whole << "."
		<< std::hex << std::setw(numDigits) << std::setfill('0') << aligned
		<< "p" << std::dec << std::setw(0) << exponent;

	return oss.str();
}